

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.cpp
# Opt level: O1

void __thiscall Event::Event(Event *this,EventRegister *_register,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->m_eventRegister = _register;
  paVar1 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_name).field_2 + 8) = uVar4;
  }
  else {
    (this->m_name)._M_dataplus._M_p = pcVar3;
    (this->m_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  (this->m_listeners).super__Vector_base<Callable,_std::allocator<Callable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_listeners).super__Vector_base<Callable,_std::allocator<Callable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_listeners).super__Vector_base<Callable,_std::allocator<Callable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Event::Event(EventRegister *_register, std::string name)
    : m_eventRegister(_register),
      m_name{std::move(name)}
{
}